

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O1

SmallVector<spirv_cross::BufferRange,_8UL> * __thiscall
spirv_cross::Compiler::get_active_buffer_ranges
          (SmallVector<spirv_cross::BufferRange,_8UL> *__return_storage_ptr__,Compiler *this,
          VariableID id)

{
  SPIRFunction *func;
  BufferAccessHandler handler;
  OpcodeHandler local_80;
  Compiler *local_78;
  SmallVector<spirv_cross::BufferRange,_8UL> *local_70;
  uint32_t local_68;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_60;
  
  (__return_storage_ptr__->super_VectorView<spirv_cross::BufferRange>).ptr = (BufferRange *)0x0;
  (__return_storage_ptr__->super_VectorView<spirv_cross::BufferRange>).buffer_size = 0;
  (__return_storage_ptr__->super_VectorView<spirv_cross::BufferRange>).ptr =
       (BufferRange *)&__return_storage_ptr__->stack_storage;
  __return_storage_ptr__->buffer_capacity = 8;
  local_80._vptr_OpcodeHandler = (_func_int **)&PTR__BufferAccessHandler_003d9428;
  local_60._M_buckets = &local_60._M_single_bucket;
  local_60._M_bucket_count = 1;
  local_60._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_60._M_element_count = 0;
  local_60._M_rehash_policy._M_max_load_factor = 1.0;
  local_60._M_rehash_policy._M_next_resize = 0;
  local_60._M_single_bucket = (__node_base_ptr)0x0;
  local_78 = this;
  local_70 = __return_storage_ptr__;
  local_68 = id.id;
  func = Variant::get<spirv_cross::SPIRFunction>
                   ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr +
                    (this->ir).default_entry_point.id);
  traverse_all_reachable_opcodes(this,func,&local_80);
  local_80._vptr_OpcodeHandler = (_func_int **)&PTR__BufferAccessHandler_003d9428;
  ::std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_60);
  return __return_storage_ptr__;
}

Assistant:

SmallVector<BufferRange> Compiler::get_active_buffer_ranges(VariableID id) const
{
	SmallVector<BufferRange> ranges;
	BufferAccessHandler handler(*this, ranges, id);
	traverse_all_reachable_opcodes(get<SPIRFunction>(ir.default_entry_point), handler);
	return ranges;
}